

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

void __thiscall Diligent::FixedLinearAllocator::Reserve(FixedLinearAllocator *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  string msg;
  string local_30;
  uint8_t *puVar2;
  
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[34]>(&local_30,(char (*) [34])"Memory has already been allocated");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Reserve",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xd0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_pAllocator == (IMemoryAllocator *)0x0) {
    FormatString<char[27]>(&local_30,(char (*) [27])"Allocator must not be null");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Reserve",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0xd1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  uVar3 = this->m_ReservedSize + 7 & 0xfffffffffffffff8;
  this->m_ReservedSize = uVar3;
  if (uVar3 != 0) {
    iVar1 = (**this->m_pAllocator->_vptr_IMemoryAllocator)
                      (this->m_pAllocator,uVar3,"Raw memory for linear allocator",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                       ,0xd6);
    puVar2 = (uint8_t *)CONCAT44(extraout_var,iVar1);
    this->m_pDataStart = puVar2;
    if (puVar2 != (uint8_t *)((ulong)(puVar2 + 7) & 0xfffffffffffffff8)) {
      FormatString<char[54]>
                (&local_30,(char (*) [54])"Memory pointer must be at least sizeof(void*)-aligned");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"Reserve",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0xd7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      puVar2 = this->m_pDataStart;
    }
    this->m_pCurrPtr = puVar2;
  }
  this->m_CurrAlignment = 8;
  return;
}

Assistant:

void Reserve()
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated");
        VERIFY(m_pAllocator != nullptr, "Allocator must not be null");
        // Make sure the data size is at least sizeof(void*)-aligned
        m_ReservedSize = AlignUp(m_ReservedSize, sizeof(void*));
        if (m_ReservedSize > 0)
        {
            m_pDataStart = reinterpret_cast<uint8_t*>(m_pAllocator->Allocate(m_ReservedSize, "Raw memory for linear allocator", __FILE__, __LINE__));
            VERIFY(m_pDataStart == AlignUp(m_pDataStart, sizeof(void*)), "Memory pointer must be at least sizeof(void*)-aligned");

            m_pCurrPtr = m_pDataStart;
        }
        m_CurrAlignment = sizeof(void*);
    }